

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfMemory.c
# Opt level: O0

void * sbfMemory_malloc(size_t size)

{
  void *pvVar1;
  size_t in_RDI;
  void *ptr;
  
  if (in_RDI == 0) {
    sbfFatal_die((char *)0x10977d);
  }
  pvVar1 = malloc(in_RDI);
  if (pvVar1 == (void *)0x0) {
    sbfFatal_die((char *)0x1097a0);
  }
  return pvVar1;
}

Assistant:

void*
sbfMemory_malloc (size_t size)
{
    void* ptr;

    if (size == 0)
        SBF_FATAL ("zero size");

    ptr = malloc (size);
    if (ptr == NULL)
        SBF_FATAL ("out of memory");
    return ptr;
}